

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

void Diligent::FormatStrSS<std::__cxx11::stringstream,char*>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char **Arg)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  
  poVar2 = (ostream *)(ss + 0x10);
  __s = *Arg;
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar1);
    return;
  }
  std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const ArgType& Arg)
{
    ss << Arg;
}